

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  pointer *ppTVar1;
  OASIS_FLOAT current_loss;
  double dVar2;
  iterator __position;
  long lVar3;
  pointer plVar4;
  bool bVar5;
  ulong uVar6;
  mapped_type *this_00;
  code *pcVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  pointer plVar10;
  long *plVar11;
  int counter;
  _Rb_tree_header *p_Var12;
  size_t nextreturnperiodindex;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  float local_f4;
  double local_e8;
  pointer local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  int local_a4;
  key_type local_a0;
  vector<lossval,_std::allocator<lossval>_> local_98;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  local_60;
  
  if ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var9 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(items->_M_t)._M_impl.super__Rb_tree_header;
    local_a4 = eptype_tvar;
    local_80 = unusedperiodstoweighting;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var9 != p_Var12) {
      local_68 = &(unusedperiodstoweighting->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_78 = &p_Var12->_M_header;
      do {
        local_a0.summary_id = p_Var9[1]._M_color;
        local_a0.sidx = *(int *)&p_Var9[1].field_0x4;
        local_70 = p_Var9;
        std::vector<lossval,_std::allocator<lossval>_>::vector
                  (&local_98,(vector<lossval,_std::allocator<lossval>_> *)&p_Var9[1]._M_parent);
        plVar10 = local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        plVar4 = local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          local_d8._0_8_ =
               local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_e0 = local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                     super__Vector_impl_data._M_start;
          uVar6 = ((long)local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar3 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          std::
          __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_d8,&local_e0,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
          local_b8 = plVar10;
          local_c0 = plVar4;
          std::
          __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_b8,&local_c0);
        }
        plVar4 = local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_e0 = (pointer)0x0;
        local_b8 = (pointer)0x0;
        local_c0 = (pointer)((ulong)local_c0 & 0xffffffff00000000);
        if (local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_f4 = 0.0;
          counter = 1;
          local_c8 = 0.0;
          local_e8 = 0.0;
        }
        else {
          local_e8 = 0.0;
          counter = 1;
          local_f4 = 0.0;
          bVar5 = false;
          local_c8 = 0.0;
          plVar10 = local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            dVar2 = plVar10->period_weighting;
            local_e8 = (double)((float)this->samplesize_ * (float)dVar2) + local_e8;
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              local_b0 = (pointer)(1.0 / local_e8);
              if (!bVar5) {
                local_c8 = (double)local_b0 + 0.0001;
              }
              current_loss = plVar10->value;
              if (this->useReturnPeriodFile_ == true) {
                local_d8._0_8_ = this->WritePSEPTOutput;
                local_d8._8_8_ = *(undefined8 *)&this->field_0x168;
                WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                          (this,fileIDs,(size_t *)&local_e0,(double *)&local_b8,
                           (OASIS_FLOAT *)&local_c0,(double)local_b0,current_loss,
                           local_a0.summary_id,eptype,local_a0.sidx,local_c8,counter,local_f4,
                           (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                            *)&local_60,local_d8._0_8_,
                           (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                            *)local_d8._8_8_);
                local_f4 = local_f4 - (local_f4 - current_loss) / (float)counter;
              }
              else {
                this_00 = std::
                          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                          ::operator[]((map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                        *)&local_60,&local_a0);
                local_f4 = local_f4 - (local_f4 - current_loss) / (float)counter;
                local_d8._0_8_ = local_b0;
                local_d8._8_4_ = local_f4;
                __position._M_current =
                     (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<TVaR,_std::allocator<TVaR>_>::_M_realloc_insert<TVaR>
                            (this_00,__position,(TVaR *)local_d8);
                }
                else {
                  (__position._M_current)->retperiod = (double)local_b0;
                  *(undefined8 *)&(__position._M_current)->tvar = local_d8._8_8_;
                  ppTVar1 = &(this_00->super__Vector_base<TVaR,_std::allocator<TVaR>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppTVar1 = *ppTVar1 + 1;
                }
                pcVar7 = (code *)this->WritePSEPTOutput;
                if (pcVar7 != (code *)0x0) {
                  plVar11 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
                  if (((ulong)pcVar7 & 1) != 0) {
                    pcVar7 = *(code **)(pcVar7 + *plVar11 + -1);
                  }
                  (*pcVar7)((int)local_b0,current_loss,plVar11,fileIDs,(ulong)local_a0 & 0xffffffff,
                            local_a0.sidx,eptype);
                }
              }
              counter = counter + 1;
              bVar5 = true;
            }
            plVar10 = plVar10 + 1;
          } while (plVar10 != plVar4);
        }
        if (this->useReturnPeriodFile_ != false) {
          p_Var8 = (local_80->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if (p_Var8 == local_68) {
              dVar2 = 0.0;
            }
            else {
              local_e8 = local_e8 + (double)this->samplesize_ * (double)p_Var8[1]._M_parent;
              dVar2 = 1.0 / local_e8;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            }
            local_d8._0_8_ = this->WritePSEPTOutput;
            local_d8._8_8_ = *(undefined8 *)&this->field_0x168;
            WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,(size_t *)&local_e0,(double *)&local_b8,(OASIS_FLOAT *)&local_c0
                       ,dVar2,0.0,local_a0.summary_id,eptype,local_a0.sidx,local_c8,counter,local_f4
                       ,(map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                         *)&local_60,local_d8._0_8_,
                       (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                        *)local_d8._8_8_);
            local_f4 = local_f4 - local_f4 / (float)counter;
            counter = counter + 1;
          } while (local_e0 <
                   (pointer)((long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->returnperiods_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
        }
        if (local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_70);
      } while (p_Var9 != local_78);
    }
    if ((this->ordFlag_ != false) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,local_a4,
                (map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&local_60);
    }
    std::
    _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec2> &items,
	int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting,
	std::map<int, std::vector<mean_count>> *mean_map) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (OASIS_FLOAT)lp.period_weighting * samplesize_;

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, os_psept_, mean_map);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value, s.first.summary_id, eptype,
			       s.first.sidx, max_retperiod, i, tvar, tail,
			       WritePSEPTOutput, mean_map);
#endif
	  tvar = tvar - ((tvar - lp.value) / i);
	} else {
	  tvar = tvar - ((tvar - lp.value) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WritePSEPTOutput != nullptr) {
	    (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				      eptype, retperiod, lp.value);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[PSEPT] != "") {
	    WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			       eptype, retperiod, lp.value);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * samplesize_);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_, mean_map);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     mean_map);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}